

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_graph.c
# Opt level: O0

ecs_table_t *
ecs_table_traverse_remove
          (ecs_world_t *world,ecs_table_t *node,ecs_entities_t *to_remove,ecs_entities_t *removed)

{
  int iVar1;
  int iVar2;
  ecs_entity_t *peVar3;
  ulong e_00;
  ecs_edge_t *peVar4;
  ecs_table_t *local_68;
  ecs_table_t *peStack_58;
  _Bool has_case;
  ecs_table_t *next;
  ecs_edge_t *edge;
  ecs_entity_t e;
  ecs_entity_t *entities;
  int32_t count;
  int32_t i;
  ecs_entities_t *removed_local;
  ecs_entities_t *to_remove_local;
  ecs_table_t *node_local;
  ecs_world_t *world_local;
  
  iVar1 = to_remove->count;
  peVar3 = to_remove->array;
  local_68 = node;
  if (node == (ecs_table_t *)0x0) {
    local_68 = &(world->store).root;
  }
  to_remove_local = (ecs_entities_t *)local_68;
  entities._4_4_ = 0;
  do {
    if (iVar1 <= entities._4_4_) {
      return (ecs_table_t *)to_remove_local;
    }
    e_00 = peVar3[entities._4_4_];
    _ecs_assert(e_00 != 0,2,(char *)0x0,"e != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                ,0x220);
    if (e_00 == 0) {
      __assert_fail("e != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                    ,0x220,
                    "ecs_table_t *ecs_table_traverse_remove(ecs_world_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                   );
    }
    peVar4 = get_edge((ecs_table_t *)to_remove_local,e_00);
    peStack_58 = peVar4->remove;
    if (peStack_58 == (ecs_table_t *)0x0) {
      if (peVar4->add == (ecs_table_t *)to_remove_local) {
        peStack_58 = find_or_create_table_exclude(world,(ecs_table_t *)to_remove_local,e_00);
        if (peStack_58 == (ecs_table_t *)0x0) {
          return (ecs_table_t *)0x0;
        }
        peVar4->remove = peStack_58;
        goto LAB_0013872f;
      }
    }
    else {
LAB_0013872f:
      if ((removed != (ecs_entities_t *)0x0) &&
         (((ecs_table_t *)to_remove_local != peStack_58 ||
          ((e_00 & 0xff00000000000000) == 0xfc00000000000000)))) {
        iVar2 = removed->count;
        removed->count = iVar2 + 1;
        removed->array[iVar2] = e_00;
      }
      to_remove_local = (ecs_entities_t *)peStack_58;
    }
    entities._4_4_ = entities._4_4_ + 1;
  } while( true );
}

Assistant:

ecs_table_t* ecs_table_traverse_remove(
    ecs_world_t * world,
    ecs_table_t * node,
    ecs_entities_t * to_remove,
    ecs_entities_t * removed)
{
    int32_t i, count = to_remove->count;
    ecs_entity_t *entities = to_remove->array;
    node = node ? node : &world->store.root;

    for (i = 0; i < count; i ++) {
        ecs_entity_t e = entities[i];

        /* Removing 0 from an entity is not valid */
        ecs_assert(e != 0, ECS_INVALID_PARAMETER, NULL);

        ecs_edge_t *edge = get_edge(node, e);
        ecs_table_t *next = edge->remove;

        if (!next) {
            if (edge->add == node) {
                /* Find table with all components of node except 'e' */
                next = find_or_create_table_exclude(world, node, e);
                if (!next) {
                    return NULL;
                }

                edge->remove = next;
            } else {
                /* If the add edge does not point to self, the table
                 * does not have the entity in to_remove. */
                continue;
            }
        }

        bool has_case = ECS_HAS_ROLE(e, CASE);
        if (removed && (node != next || has_case)) {
            removed->array[removed->count ++] = e; 
        }

        node = next;
    }    

    return node;
}